

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::AddDefaultGenerators(cmake *this)

{
  cmGlobalGeneratorFactory *local_18;
  
  local_18 = cmGlobalUnixMakefileGenerator3::NewFactory();
  std::vector<cmGlobalGeneratorFactory*,std::allocator<cmGlobalGeneratorFactory*>>::
  emplace_back<cmGlobalGeneratorFactory*>
            ((vector<cmGlobalGeneratorFactory*,std::allocator<cmGlobalGeneratorFactory*>> *)this,
             &local_18);
  local_18 = cmGlobalNinjaGenerator::NewFactory();
  std::vector<cmGlobalGeneratorFactory*,std::allocator<cmGlobalGeneratorFactory*>>::
  emplace_back<cmGlobalGeneratorFactory*>
            ((vector<cmGlobalGeneratorFactory*,std::allocator<cmGlobalGeneratorFactory*>> *)this,
             &local_18);
  local_18 = cmGlobalWatcomWMakeGenerator::NewFactory();
  std::vector<cmGlobalGeneratorFactory*,std::allocator<cmGlobalGeneratorFactory*>>::
  emplace_back<cmGlobalGeneratorFactory*>
            ((vector<cmGlobalGeneratorFactory*,std::allocator<cmGlobalGeneratorFactory*>> *)this,
             &local_18);
  return;
}

Assistant:

void cmake::AddDefaultGenerators()
{
#if defined(_WIN32) && !defined(__CYGWIN__)
# if !defined(CMAKE_BOOT_MINGW)
  this->Generators.push_back(
    cmGlobalVisualStudio14Generator::NewFactory());
  this->Generators.push_back(
    cmGlobalVisualStudio12Generator::NewFactory());
  this->Generators.push_back(
    cmGlobalVisualStudio11Generator::NewFactory());
  this->Generators.push_back(
    cmGlobalVisualStudio10Generator::NewFactory());
  this->Generators.push_back(
    cmGlobalVisualStudio9Generator::NewFactory());
  this->Generators.push_back(
    cmGlobalVisualStudio8Generator::NewFactory());
  this->Generators.push_back(
    cmGlobalVisualStudio71Generator::NewFactory());
  this->Generators.push_back(
    cmGlobalVisualStudio7Generator::NewFactory());
  this->Generators.push_back(
    cmGlobalVisualStudio6Generator::NewFactory());
  this->Generators.push_back(
    cmGlobalBorlandMakefileGenerator::NewFactory());
  this->Generators.push_back(
    cmGlobalNMakeMakefileGenerator::NewFactory());
  this->Generators.push_back(
    cmGlobalJOMMakefileGenerator::NewFactory());
  this->Generators.push_back(
    cmGlobalGhsMultiGenerator::NewFactory());
# endif
  this->Generators.push_back(
    cmGlobalMSYSMakefileGenerator::NewFactory());
  this->Generators.push_back(
    cmGlobalMinGWMakefileGenerator::NewFactory());
#endif
  this->Generators.push_back(
    cmGlobalUnixMakefileGenerator3::NewFactory());
  this->Generators.push_back(
    cmGlobalNinjaGenerator::NewFactory());
#if defined(CMAKE_USE_WMAKE)
  this->Generators.push_back(
    cmGlobalWatcomWMakeGenerator::NewFactory());
#endif
#ifdef CMAKE_USE_XCODE
  this->Generators.push_back(
    cmGlobalXCodeGenerator::NewFactory());
#endif
}